

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

string * __thiscall
cmCTestGIT::FindGitDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string git_dir_line;
  char *git_rev_parse [4];
  OutputLogger rev_parse_err;
  OneLineParser rev_parse_out;
  long *local_138 [2];
  long local_128 [2];
  string local_118;
  pointer local_f8;
  char *local_f0;
  char *local_e8;
  undefined8 local_e0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  OutputLogger local_b0;
  OneLineParser local_70;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_f8 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_f0 = "rev-parse";
  local_e8 = "--git-dir";
  local_e0 = 0;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  OneLineParser::OneLineParser(&local_70,this,"rev-parse-out> ",&local_118);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_b0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-parse-err> ");
  bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,&local_f8,(OutputParser *)&local_70,
                              (OutputParser *)&local_b0,(char *)0x0);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x590c86);
  }
  if (*(__return_storage_ptr__->_M_dataplus)._M_p == '.') {
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,pcVar1,
               pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory.
                        _M_string_length);
    std::__cxx11::string::append((char *)local_138);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_138,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p)
    ;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_c0 = *plVar4;
      lStack_b8 = plVar3[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar4;
      local_d0 = (long *)*plVar3;
    }
    local_c8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
  }
  local_b0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.super_LineParser.Line._M_dataplus._M_p != &local_b0.super_LineParser.Line.field_2)
  {
    operator_delete(local_b0.super_LineParser.Line._M_dataplus._M_p,
                    local_b0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_70.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006bc790;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_LineParser.Line._M_dataplus._M_p != &local_70.super_LineParser.Line.field_2)
  {
    operator_delete(local_70.super_LineParser.Line._M_dataplus._M_p,
                    local_70.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindGitDir()
{
  std::string git_dir;

  // Run "git rev-parse --git-dir" to locate the real .git directory.
  const char* git = this->CommandLineTool.c_str();
  char const* git_rev_parse[] = {git, "rev-parse", "--git-dir", 0};
  std::string git_dir_line;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", git_dir_line);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if(this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err))
    {
    git_dir = git_dir_line;
    }
  if(git_dir.empty())
    {
    git_dir = ".git";
    }

  // Git reports a relative path only when the .git directory is in
  // the current directory.
  if(git_dir[0] == '.')
    {
    git_dir = this->SourceDirectory + "/" + git_dir;
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
  else if(git_dir[0] == '/')
    {
    // Cygwin Git reports a full path that Cygwin understands, but we
    // are a Windows application.  Run "cygpath" to get Windows path.
    std::string cygpath_exe = cmSystemTools::GetFilenamePath(git);
    cygpath_exe += "/cygpath.exe";
    if(cmSystemTools::FileExists(cygpath_exe.c_str()))
      {
      char const* cygpath[] = {cygpath_exe.c_str(), "-w", git_dir.c_str(), 0};
      OneLineParser cygpath_out(this, "cygpath-out> ", git_dir_line);
      OutputLogger cygpath_err(this->Log, "cygpath-err> ");
      if(this->RunChild(cygpath, &cygpath_out, &cygpath_err))
        {
        git_dir = git_dir_line;
        }
      }
    }
#endif
  return git_dir;
}